

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
::insert_boundary<std::initializer_list<unsigned_int>>
          (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
           *this,ID_index cellIndex,initializer_list<unsigned_int> *boundary,Dimension dim)

{
  Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
  *this_00;
  Index currentIndex;
  iterator iVar1;
  ID_index IVar2;
  ulong uVar3;
  uint local_40;
  ID_index local_3c;
  initializer_list<unsigned_int> *local_38;
  
  local_3c = cellIndex;
  if (*(ID_index *)(this + 0x198) != cellIndex) {
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)this,this + 0x198,&local_3c);
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,unsigned_int&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)(this + 0x88),&local_3c,this + 0x198);
  }
  IVar2 = local_3c;
  if (dim == -1) {
    if (boundary->_M_len == 0) {
      dim = 0;
    }
    else {
      dim = (int)boundary->_M_len + -1;
    }
  }
  this_00 = (Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
             *)(this + 0xc0);
  local_38 = boundary;
  if (this[0xf0] ==
      (RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
       )0x1) {
    Base_swap<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>,_Gudhi::persistence_matrix::Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>_>
    ::_orderRows(this_00);
  }
  uVar3 = (ulong)(*(long *)(this + 200) - *(long *)(this + 0xc0)) >> 2;
  local_40 = (uint)uVar3;
  if (local_40 <= IVar2) {
    do {
      iVar1._M_current = *(uint **)(this + 200);
      if (iVar1._M_current == *(uint **)(this + 0xd0)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_00,iVar1,&local_40);
      }
      else {
        *iVar1._M_current = (uint)uVar3;
        *(uint **)(this + 200) = iVar1._M_current + 1;
      }
      iVar1._M_current = *(uint **)(this + 0xe0);
      if (iVar1._M_current == *(uint **)(this + 0xe8)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)(this + 0xd8),iVar1,
                   &local_40);
      }
      else {
        *iVar1._M_current = local_40;
        *(uint **)(this + 0xe0) = iVar1._M_current + 1;
      }
      local_40 = local_40 + 1;
      uVar3 = (ulong)local_40;
    } while (local_40 <= IVar2);
  }
  Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
  ::_container_insert<std::initializer_list<unsigned_int>>
            ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,true>>>
              *)this_00,local_38,*(Index *)(this + 0x110),dim);
  currentIndex = *(Index *)(this + 0x110);
  *(Index *)(this + 0x110) = currentIndex + 1;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
  ::_insert_boundary((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_true>_>_>
                      *)this,currentIndex);
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::insert_boundary(ID_index cellIndex,
                                                      const Boundary_range& boundary,
                                                      Dimension dim)
{
  // maps for possible shifting between column content and position indices used for birth events
  if constexpr (Master_matrix::Option_list::has_column_pairings && !Master_matrix::Option_list::has_vine_update) {
    if (cellIndex != nextEventIndex_) {
      Pair_opt::idToPosition_.emplace(cellIndex, nextEventIndex_);
      if constexpr (Master_matrix::Option_list::has_removable_columns) {
        Pair_opt::PIDM::map_.emplace(nextEventIndex_, cellIndex);
      }
    }
  }
  if constexpr (Master_matrix::Option_list::has_vine_update) {
    if (cellIndex != nextEventIndex_) {
      Swap_opt::_positionToRowIdx().emplace(nextEventIndex_, cellIndex);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        Swap_opt::template RU_pairing<Master_matrix>::idToPosition_.emplace(cellIndex, nextEventIndex_);
      }
    }
  }
  _insert_boundary(reducedMatrixR_.insert_boundary(cellIndex, boundary, dim));
}